

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O1

int Ssw_ManSweepBmcFilter(Ssw_Man_t *p,int TimeLimit)

{
  int iVar1;
  void *pvVar2;
  Ssw_Pars_t *pSVar3;
  int iVar4;
  Aig_Man_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  Aig_Obj_t *p1;
  uint uVar14;
  Aig_Obj_t *pAVar15;
  char *format;
  uint uVar16;
  Aig_Man_t *p_00;
  Aig_Man_t *pAVar17;
  timespec ts;
  timespec local_40;
  
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  uVar16 = p->pPars->nFramesK * p->pAig->vObjs->nSize;
  p_00 = (Aig_Man_t *)(ulong)uVar16;
  pAVar5 = Aig_ManStart(uVar16);
  p->pFrames = pAVar5;
  pAVar5 = p->pAig;
  if (0 < pAVar5->nRegs) {
    iVar4 = 0;
    do {
      uVar16 = pAVar5->nTruePis + iVar4;
      if (((int)uVar16 < 0) || (pAVar5->vCis->nSize <= (int)uVar16)) {
LAB_005e4ef5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p_00 = (Aig_Man_t *)p->pFrames->pConst1;
      pAVar17 = (Aig_Man_t *)((ulong)p_00 ^ 1);
      if ((p->pPatWords[uVar16 >> 5] >> (uVar16 & 0x1f) & 1) != 0) {
        pAVar17 = p_00;
      }
      p->pNodeToFrames[(long)*(int *)((long)pAVar5->vCis->pArray[uVar16] + 0x24) * (long)p->nFrames]
           = (Aig_Obj_t *)pAVar17;
      iVar4 = iVar4 + 1;
      pAVar5 = p->pAig;
    } while (iVar4 < pAVar5->nRegs);
  }
  if (0 < p->pPars->nFramesK) {
    uVar16 = 0;
    do {
      iVar4 = p->nFrames;
      if (uVar16 == iVar4 - 1U) {
        pAVar5 = p->pAig;
        ppAVar6 = (Aig_Obj_t **)calloc((long)(pAVar5->vObjs->nSize * iVar4 * 2),8);
        if (0 < iVar4) {
          iVar10 = 0;
          do {
            pVVar8 = pAVar5->vObjs;
            if (0 < pVVar8->nSize) {
              lVar13 = 0;
              do {
                if (pVVar8->pArray[lVar13] != (void *)0x0) {
                  iVar1 = *(int *)((long)pVVar8->pArray[lVar13] + 0x24);
                  ppAVar6[iVar1 * iVar4 * 2 + iVar10] = p->pNodeToFrames[iVar1 * iVar4 + iVar10];
                }
                lVar13 = lVar13 + 1;
                pVVar8 = pAVar5->vObjs;
              } while (lVar13 < pVVar8->nSize);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != iVar4);
        }
        p_00 = (Aig_Man_t *)p->pNodeToFrames;
        if (p_00 != (Aig_Man_t *)0x0) {
          free(p_00);
          p->pNodeToFrames = (Aig_Obj_t **)0x0;
        }
        p->pNodeToFrames = ppAVar6;
        p->nFrames = p->nFrames << 1;
      }
      p->pNodeToFrames[(int)(p->pAig->pConst1->Id * p->nFrames + uVar16)] = p->pFrames->pConst1;
      pAVar5 = p->pAig;
      if (0 < pAVar5->nTruePis) {
        lVar13 = 0;
        do {
          if (pAVar5->vCis->nSize <= lVar13) goto LAB_005e4ef5;
          pvVar2 = pAVar5->vCis->pArray[lVar13];
          p_00 = p->pFrames;
          pAVar7 = Aig_ObjCreateCi(p_00);
          p->pNodeToFrames[(int)(*(int *)((long)pvVar2 + 0x24) * p->nFrames + uVar16)] = pAVar7;
          lVar13 = lVar13 + 1;
          pAVar5 = p->pAig;
        } while (lVar13 < pAVar5->nTruePis);
      }
      pVVar8 = p->pAig->vObjs;
      if (pVVar8->nSize < 1) {
        lVar13 = 0;
      }
      else {
        lVar13 = 0;
        do {
          pAVar7 = (Aig_Obj_t *)pVVar8->pArray[lVar13];
          if ((pAVar7 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7))
          {
            if (((ulong)pAVar7 & 1) != 0) goto LAB_005e4f14;
            uVar9 = (ulong)pAVar7->pFanin0 & 0xfffffffffffffffe;
            if (uVar9 == 0) {
              pAVar15 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar15 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar7->pFanin0 & 1) ^
                        (ulong)p->pNodeToFrames[(int)(*(int *)(uVar9 + 0x24) * p->nFrames + uVar16)]
                        );
            }
            uVar9 = (ulong)pAVar7->pFanin1 & 0xfffffffffffffffe;
            if (uVar9 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar7->pFanin1 & 1) ^
                   (ulong)p->pNodeToFrames[(int)(*(int *)(uVar9 + 0x24) * p->nFrames + uVar16)]);
            }
            pAVar15 = Aig_And(p->pFrames,pAVar15,p1);
            p->pNodeToFrames[(int)(pAVar7->Id * p->nFrames + uVar16)] = pAVar15;
            p_00 = (Aig_Man_t *)p;
            iVar4 = Ssw_ManSweepNodeFilter(p,pAVar7,uVar16);
            if (iVar4 != 0) break;
          }
          lVar13 = lVar13 + 1;
          pVVar8 = p->pAig->vObjs;
        } while (lVar13 < pVVar8->nSize);
      }
      if (p->pPars->fVerbose != 0) {
        Abc_Print((int)p_00,"Frame %4d : ",(ulong)uVar16);
        p_00 = (Aig_Man_t *)p->ppClasses;
        Ssw_ClassesPrint((Ssw_Cla_t *)p_00,0);
      }
      pSVar3 = p->pPars;
      if ((int)lVar13 < p->pAig->vObjs->nSize) {
        if (pSVar3->fVerbose == 0) {
          return 1;
        }
        uVar11 = pSVar3->nBTLimit;
        format = "Exceeded the resource limits (%d conflicts). Quitting...\n";
LAB_005e4eda:
        Abc_Print((int)p_00,format,(ulong)uVar11);
        return 1;
      }
      uVar11 = pSVar3->nFramesK;
      if (uVar16 == uVar11 - 1) {
        if (pSVar3->fVerbose == 0) {
          return 1;
        }
        format = "Exceeded the time frame limit (%d time frames). Quitting...\n";
        goto LAB_005e4eda;
      }
      if (TimeLimit != 0) {
        p_00 = (Aig_Man_t *)0x3;
        iVar4 = clock_gettime(3,&local_40);
        if (iVar4 < 0) {
          lVar13 = -1;
        }
        else {
          lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        if ((float)TimeLimit <= (float)(lVar13 + lVar12) / 1e+06) {
          return 1;
        }
      }
      pVVar8 = p->pAig->vCos;
      if (0 < pVVar8->nSize) {
        lVar13 = 0;
        do {
          pvVar2 = pVVar8->pArray[lVar13];
          if (((ulong)pvVar2 & 1) != 0) {
LAB_005e4f14:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar9 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
          if (uVar9 == 0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            p_00 = (Aig_Man_t *)p->pNodeToFrames;
            pAVar7 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                     *(ulong *)(p_00->nObjs +
                               (long)(int)(*(int *)(uVar9 + 0x24) * p->nFrames + uVar16) * 2 + -0x20
                               ));
          }
          p->pNodeToFrames[(int)(*(int *)((long)pvVar2 + 0x24) * p->nFrames + uVar16)] = pAVar7;
          lVar13 = lVar13 + 1;
          pVVar8 = p->pAig->vCos;
        } while (lVar13 < pVVar8->nSize);
      }
      pAVar5 = p->pAig;
      if (0 < pAVar5->nRegs) {
        iVar4 = 0;
        do {
          uVar11 = pAVar5->nTruePos + iVar4;
          if (((((int)uVar11 < 0) || (pAVar5->vCos->nSize <= (int)uVar11)) ||
              (uVar14 = pAVar5->nTruePis + iVar4, (int)uVar14 < 0)) ||
             (pAVar5->vCis->nSize <= (int)uVar14)) goto LAB_005e4ef5;
          pAVar7 = p->pNodeToFrames
                   [(int)(*(int *)((long)pAVar5->vCos->pArray[uVar11] + 0x24) * p->nFrames + uVar16)
                   ];
          p->pNodeToFrames
          [(int)(p->nFrames * *(int *)((long)pAVar5->vCis->pArray[uVar14] + 0x24) + uVar16 + 1)] =
               pAVar7;
          p_00 = (Aig_Man_t *)p->pMSat;
          Ssw_CnfNodeAddToSolver
                    ((Ssw_Sat_t *)p_00,(Aig_Obj_t *)((ulong)pAVar7 & 0xfffffffffffffffe));
          iVar4 = iVar4 + 1;
          pAVar5 = p->pAig;
        } while (iVar4 < pAVar5->nRegs);
      }
      uVar16 = uVar16 + 1;
    } while ((int)uVar16 < p->pPars->nFramesK);
  }
  return 1;
}

Assistant:

int Ssw_ManSweepBmcFilter( Ssw_Man_t * p, int TimeLimit )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int f, f1, i;
    abctime clkTotal = Abc_Clock();
    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        if ( Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i ) )
        {
            Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst1(p->pFrames) );
//Abc_Print( 1, "1" );
        }
        else
        {
            Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );
//Abc_Print( 1, "0" );
        }
    }
//Abc_Print( 1, "\n" );

    // sweep internal nodes
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // realloc mapping of timeframes
        if ( f == p->nFrames-1 )
        {
            Aig_Obj_t ** pNodeToFrames;
            pNodeToFrames = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) * 2 * p->nFrames );
            for ( f1 = 0; f1 < p->nFrames; f1++ )
            {
                Aig_ManForEachObj( p->pAig, pObj, i )
                    pNodeToFrames[2*p->nFrames*pObj->Id + f1] = Ssw_ObjFrame( p, pObj, f1 );
            }
            ABC_FREE( p->pNodeToFrames );
            p->pNodeToFrames = pNodeToFrames;
            p->nFrames *= 2;
        }
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(p->pFrames);
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            if ( Ssw_ManSweepNodeFilter( p, pObj, f ) )
                break;
        }
        // printout
        if ( p->pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d : ", f );
            Ssw_ClassesPrint( p->ppClasses, 0 );
        }
        if ( i < Vec_PtrSize(p->pAig->vObjs) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Exceeded the resource limits (%d conflicts). Quitting...\n", p->pPars->nBTLimit );
            break;
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Exceeded the time frame limit (%d time frames). Quitting...\n", p->pPars->nFramesK );
            break;
        }
        // check timeout
        if ( TimeLimit && ((float)TimeLimit <= (float)(Abc_Clock()-clkTotal)/(float)(CLOCKS_PER_SEC)) )
            break;
        // transfer latch input to the latch outputs 
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    // verify
//    Ssw_ClassesCheck( p->ppClasses );
    return 1;
}